

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

LogEst sqlite3LogEst(u64 x)

{
  short local_1a;
  u64 uStack_18;
  LogEst y;
  u64 x_local;
  
  local_1a = 0x28;
  uStack_18 = x;
  if (x < 8) {
    if (x < 2) {
      return 0;
    }
    for (; uStack_18 < 8; uStack_18 = uStack_18 << 1) {
      local_1a = local_1a + -10;
    }
  }
  else {
    for (; 0xff < uStack_18; uStack_18 = uStack_18 >> 4) {
      local_1a = local_1a + 0x28;
    }
    for (; 0xf < uStack_18; uStack_18 = uStack_18 >> 1) {
      local_1a = local_1a + 10;
    }
  }
  return sqlite3LogEst::a[uStack_18 & 7] + local_1a + -10;
}

Assistant:

SQLITE_PRIVATE LogEst sqlite3LogEst(u64 x){
  static LogEst a[] = { 0, 2, 3, 5, 6, 7, 8, 9 };
  LogEst y = 40;
  if( x<8 ){
    if( x<2 ) return 0;
    while( x<8 ){  y -= 10; x <<= 1; }
  }else{
    while( x>255 ){ y += 40; x >>= 4; }  /*OPTIMIZATION-IF-TRUE*/
    while( x>15 ){  y += 10; x >>= 1; }
  }
  return a[x&7] + y - 10;
}